

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_syslog.c
# Opt level: O0

void print(zt_log_ty *log,zt_log_level level,char *file,int line,char *function,char *fmt,
          __va_list_tag *ap)

{
  char *__fmt;
  undefined4 in_ESI;
  __gnuc_va_list in_stack_00000008;
  uint level_flag;
  int syslog_level;
  char *nfmt;
  zt_log_level in_stack_0000020c;
  char *in_stack_00000210;
  int in_stack_0000021c;
  char *in_stack_00000220;
  char *in_stack_00000228;
  zt_log_ty *in_stack_00000230;
  uint in_stack_00000240;
  int local_3c;
  
  switch(in_ESI) {
  case 0:
    local_3c = 0;
    break;
  case 1:
    local_3c = 1;
    break;
  case 2:
    local_3c = 2;
    break;
  case 3:
    local_3c = 3;
    break;
  case 4:
    local_3c = 4;
    break;
  case 5:
    local_3c = 5;
    break;
  case 6:
    local_3c = 6;
    break;
  case 7:
    local_3c = 7;
    break;
  default:
    local_3c = 3;
  }
  __fmt = zt_log_gen_fmt(in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_0000021c,
                         in_stack_00000210,in_stack_0000020c,in_stack_00000240);
  vsyslog(local_3c,__fmt,in_stack_00000008);
  if (__fmt != (char *)0x0) {
    free(__fmt);
  }
  return;
}

Assistant:

static void
print(zt_log_ty * log, zt_log_level level, const char * file, int line, const char * function, const char * fmt, va_list ap) {
    char       * nfmt         = NULL;
    int          syslog_level = 0;
    unsigned int level_flag   = 0;

    switch (level) {
        case zt_log_emerg:
            syslog_level = LOG_EMERG;
            break;
        case zt_log_alert:
            syslog_level = LOG_ALERT;
            break;
        case zt_log_crit:
            syslog_level = LOG_CRIT;
            break;
        case zt_log_err:
            syslog_level = LOG_ERR;
            break;
        case zt_log_warning:
            syslog_level = LOG_WARNING;
            break;
        case zt_log_notice:
            syslog_level = LOG_NOTICE;
            break;
        case zt_log_info:
            syslog_level = LOG_INFO;
            break;
        case zt_log_debug:
            syslog_level = LOG_DEBUG;
            break;
        default:
            syslog_level = LOG_ERR;
            break;
    } /* switch */

    /* honor level flag if it is set in the logger opts. for the rest of the
     * zt flags, defer to syslog settings */
    level_flag = (log->opts & ZT_LOG_WITH_LEVEL) ? ZT_LOG_WITH_LEVEL : 0;
    nfmt       = zt_log_gen_fmt(log, fmt, file, line, function, level, level_flag);
    vsyslog(syslog_level, nfmt, ap);

    zt_free(nfmt);
}